

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  undefined8 uVar1;
  byte local_31;
  cf_call_data save;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  save.data._4_4_ = CURLE_OK;
  *done = true;
  if (((byte)cf->field_0x24 >> 1 & 1) == 0) {
    uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
    *(Curl_easy **)((long)cf->ctx + 0x38) = data;
    save.data._4_4_ = (*Curl_ssl->shut_down)(cf,data,true,done);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"cf_shutdown -> %d, done=%d",(ulong)save.data._4_4_,
                        (ulong)(*done & 1));
    }
    *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
    local_31 = 1;
    if (save.data._4_4_ == CURLE_OK) {
      local_31 = *done;
    }
    cf->field_0x24 = cf->field_0x24 & 0xfd | (local_31 & 1) << 1;
  }
  return save.data._4_4_;
}

Assistant:

static CURLcode ssl_cf_shutdown(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                bool *done)
{
  CURLcode result = CURLE_OK;

  *done = TRUE;
  if(!cf->shutdown) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    result = Curl_ssl->shut_down(cf, data, TRUE, done);
    CURL_TRC_CF(data, cf, "cf_shutdown -> %d, done=%d", result, *done);
    CF_DATA_RESTORE(cf, save);
    cf->shutdown = (result || *done);
  }
  return result;
}